

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

bool AreMembersAligned(ExternTypeInfo *lType,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  uint pos;
  ExternTypeInfo *memberType;
  ExternMemberInfo *member;
  uint m;
  bool aligned;
  ExternMemberInfo *exTypeExtra_local;
  ExternTypeInfo *exTypes_local;
  ExternTypeInfo *lType_local;
  
  member._7_1_ = true;
  for (member._0_4_ = 0; (uint)member < (lType->field_8).arrSize; member._0_4_ = (uint)member + 1) {
    uVar1 = exTypeExtra[(lType->field_11).subType + (uint)member].offset;
    switch(exTypes[exTypeExtra[(lType->field_11).subType + (uint)member].type].type) {
    case TYPE_COMPLEX:
      break;
    case TYPE_VOID:
      break;
    case TYPE_INT:
      if ((uVar1 & 3) != 0) {
        member._7_1_ = false;
      }
      break;
    case TYPE_FLOAT:
      break;
    case TYPE_LONG:
      if ((uVar1 & 7) != 0) {
        member._7_1_ = false;
      }
      break;
    case TYPE_DOUBLE:
      break;
    case TYPE_SHORT:
      if ((uVar1 & 1) != 0) {
        member._7_1_ = false;
      }
      break;
    case TYPE_CHAR:
    }
  }
  return member._7_1_;
}

Assistant:

bool AreMembersAligned(ExternTypeInfo *lType, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	bool aligned = 1;
	for(unsigned m = 0; m < lType->memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[lType->memberOffset + m];
		ExternTypeInfo &memberType = exTypes[member.type];
		unsigned pos = member.offset;

		switch(memberType.type)
		{
		case ExternTypeInfo::TYPE_COMPLEX:
			break;
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_INT:
			if(pos % 4 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			break;
		case ExternTypeInfo::TYPE_LONG:
			if(pos % 8 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			break;
		case ExternTypeInfo::TYPE_SHORT:
			if(pos % 2 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_CHAR:
			break;
		}
		pos += memberType.size;
	}
	//printf("%s\n", aligned ? "aligned" : "unaligned");
	return aligned;
}